

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O0

Bit32u __thiscall
MT32Emu::MidiStreamParserImpl::parseSysex(MidiStreamParserImpl *this,Bit8u *stream,Bit32u length)

{
  byte bVar1;
  bool bVar2;
  uint local_28;
  Bit8u nextByte;
  Bit32u sysexLength;
  Bit32u length_local;
  Bit8u *stream_local;
  MidiStreamParserImpl *this_local;
  
  local_28 = 1;
  this_local._4_4_ = local_28;
  do {
    local_28 = this_local._4_4_;
    if (length <= local_28) goto LAB_001a61c9;
    this_local._4_4_ = local_28 + 1;
    bVar1 = stream[local_28];
  } while (bVar1 < 0x80);
  if (bVar1 == 0xf7) {
    (*this->midiReceiver->_vptr_MidiReceiver[1])(this->midiReceiver,stream,(ulong)this_local._4_4_);
  }
  else if (bVar1 < 0xf8) {
    (**this->midiReporter->_vptr_MidiReporter)
              (this->midiReporter,"parseSysex: SysEx message lacks end-of-sysex (0xf7), ignored");
    this_local._4_4_ = local_28;
  }
  else {
LAB_001a61c9:
    this->streamBufferSize = local_28;
    bVar2 = checkStreamBufferCapacity(this,false);
    if (bVar2) {
      memcpy(this->streamBuffer,stream,(ulong)local_28);
    }
    else {
      *this->streamBuffer = *stream;
      this->streamBufferSize = this->streamBufferCapacity;
    }
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

Bit32u MidiStreamParserImpl::parseSysex(const Bit8u stream[], const Bit32u length) {
	// Find SysEx length
	Bit32u sysexLength = 1;
	while (sysexLength < length) {
		Bit8u nextByte = stream[sysexLength++];
		if (0x80 <= nextByte) {
			if (nextByte == 0xF7) {
				// End of SysEx
				midiReceiver.handleSysex(stream, sysexLength);
				return sysexLength;
			}
			if (0xF8 <= nextByte) {
				// The System Realtime message must be processed right after return
				// but the SysEx is actually fragmented and to be reconstructed in streamBuffer
				--sysexLength;
				break;
			}
			// Illegal status byte in SysEx message, aborting
			midiReporter.printDebug("parseSysex: SysEx message lacks end-of-sysex (0xf7), ignored");
			// Continue parsing from that point
			return sysexLength - 1;
		}
	}

	// Store incomplete SysEx message for further processing
	streamBufferSize = sysexLength;
	if (checkStreamBufferCapacity(false)) {
		memcpy(streamBuffer, stream, sysexLength);
	} else {
		// Not enough buffer capacity, don't care about the real buffer content, just mark the first byte
		*streamBuffer = *stream;
		streamBufferSize = streamBufferCapacity;
	}
	return sysexLength;
}